

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,BinaryExpr *node)

{
  _Invoker_type *this_00;
  BuilderContext *pBVar1;
  BuilderContext *pBVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  ASTNode *pAVar7;
  LogicalExprInfo *pLVar8;
  NodeID NVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  OpType *args_1_00;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5a8;
  shared_ptr<mocker::ir::Addr> local_4a8;
  undefined1 local_498 [16];
  undefined1 local_488 [24];
  string local_470 [32];
  undefined1 local_450 [8];
  shared_ptr<mocker::ir::Reg> res;
  OpType local_438;
  OpType OStack_434;
  bool bak;
  OpType local_430;
  OpType local_42c;
  OpType local_428;
  OpType local_424;
  OpType local_420;
  OpType local_41c;
  float local_418;
  OpType local_414;
  float local_410;
  OpType local_40c;
  float local_408;
  OpType local_404;
  OpType local_400;
  OpType local_3fc;
  OpType local_3f8;
  OpType local_3f4;
  OpType local_3f0;
  OpType local_3ec;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3e8;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3e0;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3d8;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3d0;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3c8;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3c0;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3b8;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3b0;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3a8;
  pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType> local_3a0;
  initializer_list<std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>_>
  local_398;
  shared_ptr<mocker::ir::Addr> local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [24];
  string local_350 [32];
  undefined1 local_330 [8];
  shared_ptr<mocker::ir::Reg> res_1;
  undefined1 local_318 [7];
  bool bak_3;
  undefined4 local_304;
  undefined1 local_2fd;
  OpType local_2fc;
  float local_2f8;
  OpType local_2f4;
  float local_2f0;
  OpType local_2ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  OpType local_2c4;
  __node_base local_2c0;
  undefined1 local_2b8 [80];
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  shared_ptr<mocker::ir::Addr> rhs;
  shared_ptr<mocker::ir::Addr> lhs;
  undefined1 local_180 [7];
  bool bak_2;
  allocator<char> local_169;
  string local_168 [32];
  undefined1 local_148 [8];
  shared_ptr<mocker::ir::Reg> val_1;
  undefined1 auStack_130 [4];
  OpType op;
  __node_base local_128;
  function<void_()> local_120;
  undefined1 local_100 [8];
  Defer defer;
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  shared_ptr<mocker::ir::Reg> val;
  shared_ptr<mocker::ast::ASTNode> local_88;
  shared_ptr<mocker::ast::ASTNode> local_78;
  undefined1 local_68 [8];
  shared_ptr<mocker::ir::Addr> addr;
  bool bak_1;
  shared_ptr<mocker::ast::ASTNode> local_48;
  undefined1 local_38 [8];
  shared_ptr<mocker::ir::Addr> lhsAddr;
  shared_ptr<mocker::ir::Addr> rhsVal;
  BinaryExpr *node_local;
  Builder *this_local;
  
  if (node->op == Assign) {
    peVar6 = std::
             __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&node->rhs);
    visit<mocker::ast::Expression>(this,peVar6);
    pBVar1 = this->ctx;
    pAVar7 = &std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&node->rhs)->super_ASTNode;
    ast::ASTNode::getID(pAVar7);
    BuilderContext::getExprAddr
              ((BuilderContext *)
               &lhsAddr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(NodeID)pBVar1);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_48,&node->lhs);
    getElementPtr((Builder *)local_38,(shared_ptr<mocker::ast::ASTNode> *)this);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_48);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,(shared_ptr<mocker::ir::Addr> *)local_38,
               (shared_ptr<mocker::ir::Addr> *)
               &lhsAddr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_38);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr
              ((shared_ptr<mocker::ir::Addr> *)
               &lhsAddr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  else if ((node->op == Subscript) || (node->op == Member)) {
    pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
    addr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
         pLVar8->empty & 1;
    pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
    pLVar8->empty = true;
    std::enable_shared_from_this<mocker::ast::ASTNode>::shared_from_this
              ((enable_shared_from_this<mocker::ast::ASTNode> *)
               &val.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::static_pointer_cast<mocker::ast::Expression,mocker::ast::ASTNode>(&local_88);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_78,(shared_ptr<mocker::ast::Expression> *)&local_88);
    getElementPtr((Builder *)local_68,(shared_ptr<mocker::ast::ASTNode> *)this);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_78);
    std::shared_ptr<mocker::ast::Expression>::~shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)&local_88);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr
              ((shared_ptr<mocker::ast::ASTNode> *)
               &val.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar3 = addr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _3_1_;
    pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
    pLVar8->empty = (bool)(bVar3 & 1);
    pBVar1 = this->ctx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"valOrInstPtr",&local_c9);
    BuilderContext::makeTempLocalReg((BuilderContext *)local_a8,(string *)pBVar1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    BuilderContext::
    emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,(shared_ptr<mocker::ir::Reg> *)local_a8,
               (shared_ptr<mocker::ir::Addr> *)local_68);
    pBVar1 = this->ctx;
    NVar9 = ast::ASTNode::getID((ASTNode *)node);
    this_00 = &defer.action._M_invoker;
    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
              ((shared_ptr<mocker::ir::Addr> *)this_00,(shared_ptr<mocker::ir::Reg> *)local_a8);
    BuilderContext::setExprAddr(pBVar1,NVar9,(shared_ptr<mocker::ir::Addr> *)this_00);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr
              ((shared_ptr<mocker::ir::Addr> *)&defer.action._M_invoker);
    BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_a8);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_68);
  }
  else {
    _auStack_130 = node;
    local_128._M_nxt = (_Hash_node_base *)this;
    std::function<void()>::operator()
              ((function<void()> *)&local_120,(anon_class_16_2_3f94c575 *)auStack_130);
    Defer::Defer((Defer *)local_100,&local_120);
    std::function<void_()>::~function(&local_120);
    if (((int)node->op < 6) || (0xb < (int)node->op)) {
      if ((node->op == LogicalAnd) || (node->op == LogicalOr)) {
        translateLogicBinary(this,node);
        local_304 = 1;
      }
      else {
        pBVar1 = this->ctx;
        ast::ASTNode::getID((ASTNode *)node);
        BuilderContext::getExprType((BuilderContext *)local_318,(NodeID)pBVar1);
        bVar4 = isStrTy(this,(shared_ptr<mocker::ast::Type> *)local_318);
        std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_318);
        if (bVar4) {
          pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
          res_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = pLVar8->empty & 1;
          pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
          pLVar8->empty = true;
          peVar6 = std::
                   __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&node->lhs);
          visit<mocker::ast::Expression>(this,peVar6);
          peVar6 = std::
                   __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&node->rhs);
          visit<mocker::ast::Expression>(this,peVar6);
          bVar3 = res_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._7_1_;
          pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
          pLVar8->empty = (bool)(bVar3 & 1);
          pBVar1 = this->ctx;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_350,"newStr",(allocator<char> *)(local_368 + 0x17));
          BuilderContext::makeTempLocalReg((BuilderContext *)local_330,(string *)pBVar1);
          std::__cxx11::string::~string(local_350);
          std::allocator<char>::~allocator((allocator<char> *)(local_368 + 0x17));
          pBVar1 = this->ctx;
          pAVar7 = &std::
                    __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&node->lhs)->super_ASTNode;
          ast::ASTNode::getID(pAVar7);
          BuilderContext::getExprAddr((BuilderContext *)local_368,(NodeID)pBVar1);
          pBVar2 = this->ctx;
          pAVar7 = &std::
                    __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&node->rhs)->super_ASTNode;
          ast::ASTNode::getID(pAVar7);
          BuilderContext::getExprAddr((BuilderContext *)local_378,(NodeID)pBVar2);
          BuilderContext::
          emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
                    (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_330,(char (*) [12])"#string#add",
                     (shared_ptr<mocker::ir::Addr> *)local_368,
                     (shared_ptr<mocker::ir::Addr> *)local_378);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_378);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_368);
          pBVar1 = this->ctx;
          NVar9 = ast::ASTNode::getID((ASTNode *)node);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    (&local_388,(shared_ptr<mocker::ir::Reg> *)local_330);
          BuilderContext::setExprAddr(pBVar1,NVar9,&local_388);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_388);
          local_304 = 1;
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_330);
        }
        else {
          if (operator()(mocker::ast::BinaryExpr_const&)::opMap == '\0') {
            iVar5 = __cxa_guard_acquire(&operator()(mocker::ast::BinaryExpr_const&)::opMap);
            if (iVar5 != 0) {
              local_3ec = BitOr;
              local_3f0 = BitOr;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3e8,&local_3ec,&local_3f0);
              local_3f4 = BitAnd;
              local_3f8 = BitAnd;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3e0,&local_3f4,&local_3f8);
              local_3fc = Xor;
              local_400 = Xor;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3d8,&local_3fc,&local_400);
              local_404 = Shl;
              local_408 = 4.2039e-45;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3d0,&local_404,(OpType *)&local_408);
              local_40c = Shr;
              local_410 = 5.60519e-45;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3c8,&local_40c,(OpType *)&local_410);
              local_414 = Add;
              local_418 = 7.00649e-45;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3c0,&local_414,(OpType *)&local_418);
              local_41c = Sub;
              local_420 = Sub;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3b8,&local_41c,&local_420);
              local_424 = Mul;
              local_428 = Mul;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3b0,&local_424,&local_428);
              local_42c = Div;
              local_430 = Div;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3a8,&local_42c,&local_430);
              OStack_434 = Mod;
              local_438 = Mod;
              std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType,_true>
                        (&local_3a0,&stack0xfffffffffffffbcc,&local_438);
              local_398._M_array = &local_3e8;
              local_398._M_len = 10;
              SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::
              SmallMap(&operator()(mocker::ast::BinaryExpr_const&)::opMap,&local_398);
              __cxa_atexit(SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>
                           ::~SmallMap,&operator()(mocker::ast::BinaryExpr_const&)::opMap,
                           &__dso_handle);
              __cxa_guard_release(&operator()(mocker::ast::BinaryExpr_const&)::opMap);
            }
          }
          pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
          res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _7_1_ = pLVar8->empty & 1;
          pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
          pLVar8->empty = true;
          peVar6 = std::
                   __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&node->lhs);
          visit<mocker::ast::Expression>(this,peVar6);
          peVar6 = std::
                   __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&node->rhs);
          visit<mocker::ast::Expression>(this,peVar6);
          bVar3 = res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._7_1_;
          pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
          pLVar8->empty = (bool)(bVar3 & 1);
          pBVar1 = this->ctx;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_470,"",(allocator<char> *)(local_488 + 0x17));
          BuilderContext::makeTempLocalReg((BuilderContext *)local_450,(string *)pBVar1);
          std::__cxx11::string::~string(local_470);
          std::allocator<char>::~allocator((allocator<char> *)(local_488 + 0x17));
          pBVar1 = this->ctx;
          args_1_00 = SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>
                      ::at(&operator()(mocker::ast::BinaryExpr_const&)::opMap,&node->op);
          pBVar2 = this->ctx;
          pAVar7 = &std::
                    __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&node->lhs)->super_ASTNode;
          ast::ASTNode::getID(pAVar7);
          BuilderContext::getExprAddr((BuilderContext *)local_488,(NodeID)pBVar2);
          pBVar2 = this->ctx;
          pAVar7 = &std::
                    __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&node->rhs)->super_ASTNode;
          ast::ASTNode::getID(pAVar7);
          BuilderContext::getExprAddr((BuilderContext *)local_498,(NodeID)pBVar2);
          BuilderContext::
          emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType_const&,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
                    (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_450,args_1_00,
                     (shared_ptr<mocker::ir::Addr> *)local_488,
                     (shared_ptr<mocker::ir::Addr> *)local_498);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_498);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_488);
          pBVar1 = this->ctx;
          NVar9 = ast::ASTNode::getID((ASTNode *)node);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    (&local_4a8,(shared_ptr<mocker::ir::Reg> *)local_450);
          BuilderContext::setExprAddr(pBVar1,NVar9,&local_4a8);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_4a8);
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_450);
          local_304 = 0;
        }
      }
    }
    else {
      val_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = node->op - Eq;
      pBVar1 = this->ctx;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_168,"resV",&local_169);
      BuilderContext::makeTempLocalReg((BuilderContext *)local_148,(string *)pBVar1);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      pBVar1 = this->ctx;
      NVar9 = ast::ASTNode::getID((ASTNode *)node);
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                ((shared_ptr<mocker::ir::Addr> *)local_180,(shared_ptr<mocker::ir::Reg> *)local_148)
      ;
      BuilderContext::setExprAddr(pBVar1,NVar9,(shared_ptr<mocker::ir::Addr> *)local_180);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_180);
      pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
      bVar4 = pLVar8->empty;
      pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
      pLVar8->empty = true;
      peVar6 = std::
               __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&node->lhs);
      visit<mocker::ast::Expression>(this,peVar6);
      pBVar1 = this->ctx;
      pAVar7 = &std::
                __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&node->lhs)->super_ASTNode;
      ast::ASTNode::getID(pAVar7);
      BuilderContext::getExprAddr
                ((BuilderContext *)
                 &rhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (NodeID)pBVar1);
      pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
      pLVar8->empty = true;
      peVar6 = std::
               __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&node->rhs);
      visit<mocker::ast::Expression>(this,peVar6);
      pLVar8 = BuilderContext::getLogicalExprInfo(this->ctx);
      pLVar8->empty = (bool)(bVar4 & 1);
      pBVar1 = this->ctx;
      pAVar7 = &std::
                __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&node->rhs)->super_ASTNode;
      ast::ASTNode::getID(pAVar7);
      BuilderContext::getExprAddr((BuilderContext *)local_1a8,(NodeID)pBVar1);
      pBVar1 = this->ctx;
      pAVar7 = &std::
                __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&node->lhs)->super_ASTNode;
      ast::ASTNode::getID(pAVar7);
      BuilderContext::getExprType((BuilderContext *)local_1b8,(NodeID)pBVar1);
      bVar4 = isStrTy(this,(shared_ptr<mocker::ast::Type> *)local_1b8);
      std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_1b8);
      if (bVar4) {
        if (operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_ == '\0') {
          iVar5 = __cxa_guard_acquire(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_)
          ;
          if (iVar5 != 0) {
            local_2fd = 1;
            local_2c0._M_nxt = (_Hash_node_base *)local_2b8;
            local_2c4 = Eq;
            s_abi_cxx11_(&local_2e8,"#string#equal",0xd);
            std::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2b8,&local_2c4,&local_2e8);
            local_2c0._M_nxt = (_Hash_node_base *)(local_2b8 + 0x28);
            local_2ec = Ne;
            std::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[16],_true>
                      ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2c0._M_nxt,&local_2ec,(char (*) [16])"#string#inequal");
            local_2c0._M_nxt = (_Hash_node_base *)&local_268;
            local_2f0 = 1.4013e-44;
            std::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[19],_true>
                      ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2c0._M_nxt,(OpType *)&local_2f0,(char (*) [19])"#string#less_equal")
            ;
            local_2c0._M_nxt = (_Hash_node_base *)&local_240;
            local_2f4 = Lt;
            std::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[13],_true>
                      ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2c0._M_nxt,&local_2f4,(char (*) [13])"#string#less");
            local_2c0._M_nxt = (_Hash_node_base *)&local_218;
            local_2f8 = 1.54143e-44;
            std::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[19],_true>
                      ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2c0._M_nxt,(OpType *)&local_2f8,(char (*) [19])"#string#less_equal")
            ;
            local_2c0._M_nxt = (_Hash_node_base *)&local_1f0;
            local_2fc = Gt;
            std::
            pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[13],_true>
                      ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2c0._M_nxt,&local_2fc,(char (*) [13])"#string#less");
            local_2fd = 0;
            local_1c8._0_8_ = local_2b8;
            local_1c8._8_8_ = (FunctionModule *)0x6;
            SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::SmallMap(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,
                       (initializer_list<std::pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1c8);
            local_5a8 = (pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_1c8;
            do {
              local_5a8 = local_5a8 + -1;
              std::
              pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(local_5a8);
            } while (local_5a8 !=
                     (pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2b8);
            std::__cxx11::string::~string((string *)&local_2e8);
            __cxa_atexit(SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::~SmallMap,&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,
                         &__dso_handle);
            __cxa_guard_release(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_);
          }
        }
        if ((node->op == Ge) || (node->op == Gt)) {
          std::swap<mocker::ir::Addr>
                    ((shared_ptr<mocker::ir::Addr> *)
                     &rhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<mocker::ir::Addr> *)local_1a8);
        }
        pBVar1 = this->ctx;
        args_1 = SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::at(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,&node->op);
        BuilderContext::
        emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,std::__cxx11::string_const&,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                  (pBVar1,(shared_ptr<mocker::ir::Reg> *)local_148,args_1,
                   (shared_ptr<mocker::ir::Addr> *)
                   &rhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ,(shared_ptr<mocker::ir::Addr> *)local_1a8);
      }
      else {
        BuilderContext::
        emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType&,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                  (this->ctx,(shared_ptr<mocker::ir::Reg> *)local_148,
                   (OpType *)
                   ((long)&val_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 4),
                   (shared_ptr<mocker::ir::Addr> *)
                   &rhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ,(shared_ptr<mocker::ir::Addr> *)local_1a8);
      }
      BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
      local_304 = 1;
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_1a8);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                ((shared_ptr<mocker::ir::Addr> *)
                 &rhs.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_148);
    }
    Defer::~Defer((Defer *)local_100);
  }
  return;
}

Assistant:

void Builder::operator()(const ast::BinaryExpr &node) const {
  using namespace std::string_literals;
  if (node.op == ast::BinaryExpr::Assign) {
    visit(*node.rhs);
    auto rhsVal = ctx.getExprAddr(node.rhs->getID());
    auto lhsAddr = getElementPtr(node.lhs);
    ctx.emplaceInst<Store>(lhsAddr, rhsVal);
    return;
  }
  if (node.op == ast::BinaryExpr::Subscript ||
      node.op == ast::BinaryExpr::Member) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    auto addr = getElementPtr(std::static_pointer_cast<ast::Expression>(
        const_cast<ast::BinaryExpr &>(node).shared_from_this()));
    ctx.getLogicalExprInfo().empty = bak;
    auto val = ctx.makeTempLocalReg("valOrInstPtr");
    ctx.emplaceInst<Load>(val, addr);
    ctx.setExprAddr(node.getID(), val);
    ctx.checkLogicalExpr(node);
    return;
  }

  Defer defer([&node, this] {
    if (ctx.isTrivial(node.lhs) && ctx.isTrivial(node.rhs))
      ctx.markExprTrivial(node);
  });

  // Eq, Ne, Lt, Gt, Le, Ge,
  if (ast::BinaryExpr::Eq <= node.op && node.op <= ast::BinaryExpr::Ge) {
    auto op = (RelationInst::OpType)(RelationInst::Eq +
                                     (node.op - ast::BinaryExpr::Eq));
    auto val = ctx.makeTempLocalReg("resV");
    ctx.setExprAddr(node.getID(), val);

    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.lhs);
    auto lhs = ctx.getExprAddr(node.lhs->getID());
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.rhs);
    ctx.getLogicalExprInfo().empty = bak;
    auto rhs = ctx.getExprAddr(node.rhs->getID());

    if (isStrTy(ctx.getExprType(node.lhs->getID()))) {
      static SmallMap<ast::BinaryExpr::OpType, std::string> opMap{
          {ast::BinaryExpr::Eq, "#string#equal"s},
          {ast::BinaryExpr::Ne, "#string#inequal"},
          {ast::BinaryExpr::Le, "#string#less_equal"},
          {ast::BinaryExpr::Lt, "#string#less"},
          {ast::BinaryExpr::Ge, "#string#less_equal"},
          {ast::BinaryExpr::Gt, "#string#less"},
      };
      if (node.op == ast::BinaryExpr::Ge || node.op == ast::BinaryExpr::Gt) {
        std::swap(lhs, rhs);
      }
      ctx.emplaceInst<Call>(val, opMap.at(node.op), lhs, rhs);
    } else {
      ctx.emplaceInst<RelationInst>(val, op, lhs, rhs);
    }

    ctx.checkLogicalExpr(node);
    return;
  }
  if (node.op == ast::BinaryExpr::LogicalAnd ||
      node.op == ast::BinaryExpr::LogicalOr) {
    translateLogicBinary(node);
    return;
  }
  // string
  if (isStrTy(ctx.getExprType(node.getID()))) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.lhs);
    visit(*node.rhs);
    ctx.getLogicalExprInfo().empty = bak;
    auto res = ctx.makeTempLocalReg("newStr");
    ctx.emplaceInst<Call>(res, "#string#add",
                          ctx.getExprAddr(node.lhs->getID()),
                          ctx.getExprAddr(node.rhs->getID()));
    ctx.setExprAddr(node.getID(), res);
    return;
  }

  static SmallMap<ast::BinaryExpr::OpType, ArithBinaryInst::OpType> opMap{
      {ast::BinaryExpr::BitOr, ArithBinaryInst::BitOr},
      {ast::BinaryExpr::BitAnd, ArithBinaryInst::BitAnd},
      {ast::BinaryExpr::Xor, ArithBinaryInst::Xor},
      {ast::BinaryExpr::Shl, ArithBinaryInst::Shl},
      {ast::BinaryExpr::Shr, ArithBinaryInst::Shr},
      {ast::BinaryExpr::Add, ArithBinaryInst::Add},
      {ast::BinaryExpr::Sub, ArithBinaryInst::Sub},
      {ast::BinaryExpr::Mul, ArithBinaryInst::Mul},
      {ast::BinaryExpr::Div, ArithBinaryInst::Div},
      {ast::BinaryExpr::Mod, ArithBinaryInst::Mod},
  };
  auto bak = ctx.getLogicalExprInfo().empty;
  ctx.getLogicalExprInfo().empty = true;
  visit(*node.lhs);
  visit(*node.rhs);
  ctx.getLogicalExprInfo().empty = bak;
  auto res = ctx.makeTempLocalReg();
  ctx.emplaceInst<ArithBinaryInst>(res, opMap.at(node.op),
                                   ctx.getExprAddr(node.lhs->getID()),
                                   ctx.getExprAddr(node.rhs->getID()));
  ctx.setExprAddr(node.getID(), res);
}